

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTaskScheduler.cpp
# Opt level: O1

void __thiscall cbtTaskSchedulerDefault::waitJobs(cbtTaskSchedulerDefault *this)

{
  cbtSpinMutex *this_00;
  int iVar1;
  ThreadLocalStorage *pTVar2;
  IJob *pIVar3;
  unsigned_long_long uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  CProfileSample __profile;
  CProfileSample local_45;
  int local_44;
  unsigned_long_long local_40;
  cbtClock *local_38;
  
  CProfileSample::CProfileSample(&local_45,"waitJobs");
  if (this->m_numActiveJobQueues < 1) {
    iVar5 = 0;
  }
  else {
    lVar6 = 0;
    iVar5 = 0;
    do {
      while (pIVar3 = JobQueue::consumeJob((this->m_jobQueues).m_data + lVar6),
            pIVar3 != (IJob *)0x0) {
        (**pIVar3->_vptr_IJob)(pIVar3,0);
        iVar5 = iVar5 + 1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < this->m_numActiveJobQueues);
  }
  if (1 < this->m_numThreads) {
    memset(this->m_workerDirective + 1,2,(ulong)(this->m_numThreads - 2) + 1);
  }
  local_38 = &this->m_clock;
  local_40 = cbtClock::getTimeMicroseconds(local_38);
  local_44 = iVar5;
  do {
    iVar5 = 0;
    if (1 < this->m_numThreads) {
      iVar5 = 0;
      lVar7 = 1;
      lVar6 = 0x44;
      do {
        pTVar2 = (this->m_threadLocalStorage).m_data;
        this_00 = (cbtSpinMutex *)((long)&pTVar2->m_threadId + lVar6);
        cbtSpinMutex::lock(this_00);
        iVar1 = *(int *)((long)pTVar2 + lVar6 + -4);
        cbtSpinMutex::unlock(this_00);
        iVar5 = iVar5 + iVar1;
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x38;
      } while (lVar7 < this->m_numThreads);
    }
  } while ((iVar5 + local_44 != this->m_numJobs) &&
          (uVar4 = cbtClock::getTimeMicroseconds(local_38), uVar4 - local_40 < 0x186a1));
  CProfileSample::~CProfileSample(&local_45);
  return;
}

Assistant:

void waitJobs()
	{
		BT_PROFILE("waitJobs");
		// have the main thread work until the job queues are empty
		int numMainThreadJobsFinished = 0;
		for (int i = 0; i < m_numActiveJobQueues; ++i)
		{
			while (IJob* job = m_jobQueues[i].consumeJob())
			{
				job->executeJob(0);
				numMainThreadJobsFinished++;
			}
		}

		// done with jobs for now, tell workers to rest (but not sleep)
		setWorkerDirectives(WorkerThreadDirectives::kStayAwakeButIdle);

		cbtU64 clockStart = m_clock.getTimeMicroseconds();
		// wait for workers to finish any jobs in progress
		while (true)
		{
			int numWorkerJobsFinished = 0;
			for (int iThread = kFirstWorkerThreadId; iThread < m_numThreads; ++iThread)
			{
				ThreadLocalStorage* storage = &m_threadLocalStorage[iThread];
				storage->m_mutex.lock();
				numWorkerJobsFinished += storage->m_numJobsFinished;
				storage->m_mutex.unlock();
			}
			if (numWorkerJobsFinished + numMainThreadJobsFinished == m_numJobs)
			{
				break;
			}
			cbtU64 timeElapsed = m_clock.getTimeMicroseconds() - clockStart;
			cbtAssert(timeElapsed < 1000);
			if (timeElapsed > 100000)
			{
				break;
			}
			cbtSpinPause();
		}
	}